

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

void __thiscall
ON_SubDComponentIdList::AddIdList(ON_SubDComponentIdList *this,ON_SubDComponentIdList *list)

{
  ON_SubDComponentId local_28;
  uint local_20;
  uint local_1c;
  uint i;
  uint cnt;
  ON_SubDComponentIdList *list_local;
  ON_SubDComponentIdList *this_local;
  
  _i = list;
  list_local = this;
  local_1c = UnsignedCount(list);
  this->m_bSorted = false;
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    local_28 = operator[](_i,local_20);
    ON_SimpleArray<ON_SubDComponentId>::Append(&this->m_id_list,&local_28);
  }
  return;
}

Assistant:

void ON_SubDComponentIdList::AddIdList(const ON_SubDComponentIdList& list)
{
  const unsigned cnt{ list.UnsignedCount() };
  m_bSorted = false;
  for (unsigned i = 0; i < cnt; ++i)
  {
    m_id_list.Append(list[i]);
  }
}